

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

unsigned_long ndiGetPSTATCurrentTest(ndicapi *pol,int port)

{
  unsigned_long uVar1;
  char (*string) [8];
  
  if (port - 0x31U < 3) {
    string = pol->PstatTesting + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 0;
    }
    string = pol->PstatPassiveTesting + (port - 0x41U);
  }
  if ((*string)[0] == '\0') {
    return 0;
  }
  uVar1 = ndiHexToUnsignedLong(*string,8);
  return uVar1;
}

Assistant:

ndicapiExport unsigned long ndiGetPSTATCurrentTest(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatTesting[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveTesting[port - 'A'];
  }
  else
  {
    return 0;
  }

  if (*dp == '\0')
  {
    return 0;
  }

  return (unsigned long)ndiHexToUnsignedLong(dp, 8);
}